

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktxapp.h
# Opt level: O2

void __thiscall ktxApp::~ktxApp(ktxApp *this)

{
  this->_vptr_ktxApp = (_func_int **)&PTR___cxa_pure_virtual_001349e8;
  std::__cxx11::string::~string((string *)&this->short_opts);
  std::_Vector_base<argparser::option,_std::allocator<argparser::option>_>::~_Vector_base
            (&(this->option_list).
              super__Vector_base<argparser::option,_std::allocator<argparser::option>_>);
  std::__cxx11::string::~string((string *)&this->name);
  return;
}

Assistant:

virtual void usage() {
        cerr <<
            "  -h, --help    Print this usage message and exit.\n"
            "  -v, --version Print the version number of this program and exit.\n"
#if defined(_WIN32) && defined(DEBUG)
            "      --ld      Launch Visual Studio deugger at start up.\n"
#endif
            ;
    }